

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocationpool.h
# Opt level: O2

void __thiscall
rengine::AllocationPool<rengine::Node>::setMemory
          (AllocationPool<rengine::Node> *this,void *m,uint blockCount)

{
  uint __line;
  uint *puVar1;
  ulong uVar2;
  char *__assertion;
  
  if (this->m_memory == (Node *)0x0) {
    if (this->m_free == (uint *)0x0) {
      if (this->m_nextFree == 0) {
        if (this->m_poolSize == 0) {
          this->m_poolSize = blockCount;
          this->m_memory = (Node *)m;
          puVar1 = (uint *)((ulong)blockCount * 0x38 + (long)m);
          this->m_free = puVar1;
          this->m_nextFree = 0;
          for (uVar2 = 0; blockCount != uVar2; uVar2 = uVar2 + 1) {
            puVar1[uVar2] = (uint)uVar2;
          }
          return;
        }
        __assertion = "m_poolSize == 0";
        __line = 0x34;
      }
      else {
        __assertion = "m_nextFree == 0";
        __line = 0x33;
      }
    }
    else {
      __assertion = "m_free == 0";
      __line = 0x32;
    }
  }
  else {
    __assertion = "m_memory == 0";
    __line = 0x31;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                ,__line,
                "void rengine::AllocationPool<rengine::Node>::setMemory(void *, unsigned int) [T = rengine::Node]"
               );
}

Assistant:

void setMemory(void *m, unsigned blockCount) {
        assert(m_memory == 0);
        assert(m_free == 0);
        assert(m_nextFree == 0);
        assert(m_poolSize == 0);

        m_poolSize = blockCount;
        m_memory = (T *) m;
        m_free = (unsigned *) (m_memory + blockCount);
        m_nextFree = 0;
        for (unsigned i=0; i<blockCount; ++i)
            m_free[i] = i;
    }